

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32.c
# Opt level: O0

uint tinf_adler32(void *data,uint length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint local_34;
  int local_30;
  int i;
  int k;
  uint s2;
  uint s1;
  uchar *buf;
  uint length_local;
  void *data_local;
  
  k = 1;
  i = 0;
  _s2 = (byte *)data;
  for (buf._4_4_ = length; buf._4_4_ != 0; buf._4_4_ = buf._4_4_ - local_34) {
    if (buf._4_4_ < 0x15b0) {
      local_34 = buf._4_4_;
    }
    else {
      local_34 = 0x15b0;
    }
    for (local_30 = (int)local_34 / 0x10; local_30 != 0; local_30 = local_30 + -1) {
      iVar1 = (uint)*_s2 + k;
      iVar2 = (uint)_s2[1] + iVar1;
      iVar3 = (uint)_s2[2] + iVar2;
      iVar4 = (uint)_s2[3] + iVar3;
      iVar5 = (uint)_s2[4] + iVar4;
      iVar6 = (uint)_s2[5] + iVar5;
      iVar7 = (uint)_s2[6] + iVar6;
      iVar8 = (uint)_s2[7] + iVar7;
      iVar9 = (uint)_s2[8] + iVar8;
      iVar10 = (uint)_s2[9] + iVar9;
      iVar11 = (uint)_s2[10] + iVar10;
      iVar12 = (uint)_s2[0xb] + iVar11;
      iVar13 = (uint)_s2[0xc] + iVar12;
      iVar14 = (uint)_s2[0xd] + iVar13;
      iVar15 = (uint)_s2[0xe] + iVar14;
      k = (uint)_s2[0xf] + iVar15;
      i = k + iVar15 + iVar14 + iVar13 + iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + 
                                                  iVar5 + iVar4 + iVar3 + iVar2 + iVar1 + i;
      _s2 = _s2 + 0x10;
    }
    for (local_30 = (int)local_34 % 0x10; local_30 != 0; local_30 = local_30 + -1) {
      k = (uint)*_s2 + k;
      i = k + i;
      _s2 = _s2 + 1;
    }
    k = (uint)k % 0xfff1;
    i = (uint)i % 0xfff1;
  }
  return i << 0x10 | k;
}

Assistant:

unsigned int tinf_adler32(const void *data, unsigned int length)
{
	const unsigned char *buf = (const unsigned char *) data;

	unsigned int s1 = 1;
	unsigned int s2 = 0;

	while (length > 0) {
		int k = length < A32_NMAX ? length : A32_NMAX;
		int i;

		for (i = k / 16; i; --i, buf += 16) {
			s1 += buf[0];
			s2 += s1;
			s1 += buf[1];
			s2 += s1;
			s1 += buf[2];
			s2 += s1;
			s1 += buf[3];
			s2 += s1;
			s1 += buf[4];
			s2 += s1;
			s1 += buf[5];
			s2 += s1;
			s1 += buf[6];
			s2 += s1;
			s1 += buf[7];
			s2 += s1;

			s1 += buf[8];
			s2 += s1;
			s1 += buf[9];
			s2 += s1;
			s1 += buf[10];
			s2 += s1;
			s1 += buf[11];
			s2 += s1;
			s1 += buf[12];
			s2 += s1;
			s1 += buf[13];
			s2 += s1;
			s1 += buf[14];
			s2 += s1;
			s1 += buf[15];
			s2 += s1;
		}

		for (i = k % 16; i; --i) {
			s1 += *buf++;
			s2 += s1;
		}

		s1 %= A32_BASE;
		s2 %= A32_BASE;

		length -= k;
	}

	return (s2 << 16) | s1;
}